

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CNegativeDataWrongElements<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CNegativeDataWrongElements<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  GLuint GVar1;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long _code;
  size_t i;
  ulong uVar5;
  size_type __n;
  DIResult *pDVar6;
  allocator_type local_529;
  CColorArray coords;
  CElementArray elements;
  CColorArray bufferTest;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined8 local_4c4;
  undefined4 local_4bc;
  Vector<float,_4> local_4b8;
  CColorArray bufferRef;
  DIResult result;
  DILogger local_1a0;
  
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bufferRef,fixed_sample_locations_values + 1,(allocator<char> *)&elements);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)&result,(string *)&bufferRef,
                     (string *)&coords,true);
  this->_program = GVar1;
  std::__cxx11::string::~string((string *)&coords);
  std::__cxx11::string::~string((string *)&bufferRef);
  std::__cxx11::string::~string((string *)&result);
  if (this->_program == 0) {
    result.status_ = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,&coords);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               coords.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_4bc = 0;
    local_4c4 = 0;
    __n = (long)coords.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)coords.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
    local_4cc = (undefined4)__n;
    local_4c8 = 1;
    result.logger_.null_log_ = false;
    result.logger_._1_3_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&elements,__n,(value_type_conflict4 *)&result,(allocator_type *)&bufferRef);
    for (uVar5 = 0;
        uVar5 < (ulong)((long)elements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)elements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
      elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = (uint)uVar5;
    }
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_4cc,0x88e4);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8893,
               (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
               elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    DIResult::DIResult(&result);
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1406,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x500) {
      DIResult::error((DILogger *)&bufferRef,&result);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&bufferRef,
                 (char (*) [58])"Invalid error code returned by a driver for GL_FLOAT type");
      DILogger::~DILogger((DILogger *)&bufferRef);
    }
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1404,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x500) {
      pDVar6 = &result;
      DIResult::error((DILogger *)&bufferRef,pDVar6);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&bufferRef,(char (*) [56])pDVar6);
      DILogger::~DILogger((DILogger *)&bufferRef);
    }
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x88e4,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x500) {
      pDVar6 = &result;
      DIResult::error((DILogger *)&bufferRef,pDVar6);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&bufferRef,(char (*) [64])pDVar6);
      DILogger::~DILogger((DILogger *)&bufferRef);
    }
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1402,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x500) {
      DIResult::error((DILogger *)&bufferRef,&result);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&bufferRef,
                 (char (*) [58])"Invalid error code returned by a driver for GL_SHORT type");
      DILogger::~DILogger((DILogger *)&bufferRef);
    }
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1400,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x500) {
      pDVar6 = &result;
      DIResult::error((DILogger *)&bufferRef,pDVar6);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&bufferRef,(char (*) [57])pDVar6);
      DILogger::~DILogger((DILogger *)&bufferRef);
    }
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x140a,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x500) {
      pDVar6 = &result;
      DIResult::error((DILogger *)&bufferRef,pDVar6);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&bufferRef,(char (*) [59])pDVar6);
      DILogger::~DILogger((DILogger *)&bufferRef);
    }
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x500,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x500) {
      DIResult::error((DILogger *)&bufferRef,&result);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&bufferRef,
                 (char (*) [65])"Invalid error code returned by a driver for GL_INVALID_ENUM type");
      DILogger::~DILogger((DILogger *)&bufferRef);
    }
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 4);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&bufferTest,0.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferRef,(long)(iVar3 * iVar4),(value_type *)&bufferTest,
               (allocator_type *)&local_4b8);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_02,iVar4) + 4);
    tcu::Vector<float,_4>::Vector(&local_4b8,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferTest,(long)(iVar3 * iVar4),&local_4b8,&local_529);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_03,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
              (&this->super_DrawIndirectBase,0,0,iVar3,*(int *)(CONCAT44(extraout_var_04,iVar4) + 4)
               ,bufferTest.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar3) + 4);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    _code = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&bufferTest,widthTest,heightTest,&bufferRef,widthRef
                       ,*(uint *)(CONCAT44(extraout_var_08,iVar3) + 4));
    DIResult::sub_result(&local_1a0,&result,_code);
    DILogger::~DILogger(&local_1a0);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferTest.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferRef.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    DILogger::~DILogger(&result.logger_);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&coords.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  return result.status_;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		indirectElements.count						 = static_cast<GLuint>(coords.size());
		indirectElements.primCount					 = 1;

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements, GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		DIResult result;

		glDrawElementsIndirect(GL_TRIANGLES, GL_FLOAT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_FLOAT type";
		}

		glDrawElementsIndirect(GL_TRIANGLES, GL_INT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_INT type";
		}

		glDrawElementsIndirect(GL_TRIANGLES, GL_STATIC_DRAW, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_STATIC_DRAW type";
		}

		glDrawElementsIndirect(GL_TRIANGLES, GL_SHORT, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_SHORT type";
		}

		glDrawElementsIndirect(GL_TRIANGLES, GL_BYTE, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_BYTE type";
		}

		glDrawElementsIndirect(GL_TRIANGLES, GL_DOUBLE, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_DOUBLE type";
		}

		glDrawElementsIndirect(GL_TRIANGLES, GL_INVALID_ENUM, 0);
		if (glGetError() != GL_INVALID_ENUM)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_ENUM type";
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(1.0f));

		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}